

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaRedefPtr_conflict
xmlSchemaAddRedef(xmlSchemaParserCtxtPtr pctxt,xmlSchemaBucketPtr_conflict targetBucket,void *item,
                 xmlChar *refName,xmlChar *refTargetNs)

{
  xmlSchemaRedefPtr_conflict ret;
  xmlChar *refTargetNs_local;
  xmlChar *refName_local;
  void *item_local;
  xmlSchemaBucketPtr_conflict targetBucket_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  pctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x38);
  if (pctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory(pctxt);
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    memset(pctxt_local,0,0x38);
    pctxt_local->errCtxt = item;
    pctxt_local->constructor = (xmlSchemaConstructionCtxtPtr)targetBucket;
    *(xmlChar **)&pctxt_local->err = refName;
    pctxt_local->serror = (xmlStructuredErrorFunc)refTargetNs;
    if (pctxt->constructor->redefs == (xmlSchemaRedefPtr_conflict)0x0) {
      pctxt->constructor->redefs = (xmlSchemaRedefPtr_conflict)pctxt_local;
    }
    else {
      pctxt->constructor->lastRedef->next = (xmlSchemaRedefPtr)pctxt_local;
    }
    pctxt->constructor->lastRedef = (xmlSchemaRedefPtr_conflict)pctxt_local;
  }
  return (xmlSchemaRedefPtr_conflict)pctxt_local;
}

Assistant:

static xmlSchemaRedefPtr
xmlSchemaAddRedef(xmlSchemaParserCtxtPtr pctxt,
		  xmlSchemaBucketPtr targetBucket,
		  void *item,
		  const xmlChar *refName,
		  const xmlChar *refTargetNs)
{
    xmlSchemaRedefPtr ret;

    ret = (xmlSchemaRedefPtr)
	xmlMalloc(sizeof(xmlSchemaRedef));
    if (ret == NULL) {
	xmlSchemaPErrMemory(pctxt);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaRedef));
    ret->item = item;
    ret->targetBucket = targetBucket;
    ret->refName = refName;
    ret->refTargetNs = refTargetNs;
    if (WXS_CONSTRUCTOR(pctxt)->redefs == NULL)
	WXS_CONSTRUCTOR(pctxt)->redefs = ret;
    else
	WXS_CONSTRUCTOR(pctxt)->lastRedef->next = ret;
    WXS_CONSTRUCTOR(pctxt)->lastRedef = ret;

    return (ret);
}